

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<unsigned_int,unsigned_short,std::__cxx11::string_const&>,2ul>
               (long t,ostream *param_2)

{
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<unsigned_int,void,std::ostream&>((uint *)(t + 0xc),param_2);
  std::operator<<(param_2,", ");
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<unsigned_short,void,std::ostream&>((unsigned_short *)(t + 8),param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}